

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var Js::InterpreterStackFrame::InterpreterThunk(JavascriptCallStackLayout *layout)

{
  ScriptFunction *function;
  Var pvVar1;
  void *unaff_retaddr;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  function = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_40,(CallInfo *)(layout + 8),(Var *)(layout + 0x10));
  args.super_Arguments.Values = (Type)auStack_40;
  pvVar1 = InterpreterHelper(function,(ArgumentReader *)&args.super_Arguments.Values,unaff_retaddr,
                             &stack0x00000000,(AsmJsReturnStruct *)0x0);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::InterpreterThunk(JavascriptCallStackLayout* layout)
    {
        Js::ScriptFunction * function = Js::UnsafeVarTo<Js::ScriptFunction>(layout->functionObject);
        Js::ArgumentReader args(&layout->callInfo, layout->args);
        void* localReturnAddress = _ReturnAddress();
        void* localAddressOfReturnAddress = _AddressOfReturnAddress();
        return InterpreterHelper(function, args, localReturnAddress, localAddressOfReturnAddress);
    }